

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O2

size_t u16CTZ_fast(u16 w)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  
  uVar3 = w << 8;
  uVar4 = uVar3;
  if (uVar3 == 0) {
    uVar4 = w;
  }
  uVar1 = (ulong)(uVar3 == 0) * 8;
  uVar2 = uVar1 | 4;
  uVar3 = uVar4 << 4;
  if ((ushort)(uVar4 << 4) == 0) {
    uVar2 = uVar1 + 8;
    uVar3 = uVar4;
  }
  uVar4 = uVar3 * 4;
  uVar1 = uVar2 - 2;
  if (uVar4 == 0) {
    uVar1 = uVar2;
    uVar4 = uVar3;
  }
  sVar5 = -2;
  if ((uVar4 & 0x7fc0) == 0) {
    sVar5 = (short)uVar4 >> 0xf;
  }
  return (long)sVar5 + uVar1;
}

Assistant:

size_t FAST(u16CTZ)(register u16 w)
{
	register size_t l = 16;
	register u16 t;
	if (t = w << 8)
		l -= 8, w = t;
	if (t = w << 4)
		l -= 4, w = t;
	if (t = w << 2)
		l -= 2, w = t;
	t = 0;
	return ((u16)(w << 1)) ? l - 2 : l - (w ? 1 : 0);
}